

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  int iVar1;
  char *c;
  char *pcVar2;
  char *pcVar3;
  string<char> local_30;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P + 1;
  pcVar2 = c;
  do {
    pcVar3 = pcVar2;
    this->P = pcVar3;
    pcVar2 = pcVar3 + 1;
  } while (*pcVar3 != '>');
  iVar1 = isspace((int)pcVar3[-1]);
  if (iVar1 == 0) {
    iVar1 = (int)(pcVar3 + 1) + -1;
  }
  else {
    do {
      pcVar2 = pcVar3 + -1;
      this->P = pcVar2;
      iVar1 = isspace((int)pcVar3[-2]);
      pcVar3 = pcVar2;
    } while (iVar1 != 0);
    iVar1 = (int)pcVar2;
  }
  core::string<char>::string<char>(&local_30,c,iVar1 - (int)c);
  core::string<char>::operator=(&this->NodeName,&local_30);
  if (local_30.array != (char *)0x0) {
    operator_delete__(local_30.array);
  }
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}